

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVmGraph.cpp
# Opt level: O2

void DumpGraph(VmModule *module)

{
  char tempBuf [4096];
  char outputBuf [4096];
  InstructionVMGraphContext local_2288;
  OutputContext local_2258;
  char local_2018 [4096];
  char local_1018 [4104];
  
  local_2258.stream = (void *)0x0;
  local_2258.openStream = OutputContext::FileOpen;
  local_2258.writeStream = OutputContext::FileWrite;
  local_2258.closeStream = OutputContext::FileClose;
  local_2258.outputBufSize = 0x1000;
  local_2258.outputBufPos = 0;
  local_2258.outputBuf = local_1018;
  local_2258.tempBuf = local_2018;
  local_2258.tempBufSize = 0x1000;
  local_2258.stream = OutputContext::FileOpen("inst_graph.txt");
  local_2288.output = &local_2258;
  local_2288.code = (char *)0x0;
  local_2258.writeStream = OutputContext::FileWrite;
  local_2288.depth = 0;
  local_2288.lastStart = (char *)0x0;
  local_2288.lastStartOffset = 0;
  local_2288.lastEndOffset = 0;
  local_2288.showTypes = true;
  local_2288.showFullTypes = true;
  local_2288.showUsers = true;
  local_2288.showComments = true;
  local_2288.showContainers = true;
  local_2288.showSource = true;
  local_2288.showAnnotatedSource = false;
  local_2288.displayAsTree = false;
  PrintGraph(&local_2288,module);
  fclose((FILE *)local_2258.stream);
  local_2258.stream = (void *)0x0;
  OutputContext::~OutputContext(&local_2258);
  return;
}

Assistant:

void DumpGraph(VmModule *module)
{
	OutputContext outputCtx;

	char outputBuf[4096];
	outputCtx.outputBuf = outputBuf;
	outputCtx.outputBufSize = 4096;

	char tempBuf[4096];
	outputCtx.tempBuf = tempBuf;
	outputCtx.tempBufSize = 4096;

	outputCtx.stream = OutputContext::FileOpen("inst_graph.txt");
	outputCtx.writeStream = OutputContext::FileWrite;

	InstructionVMGraphContext instGraphCtx(outputCtx);

	instGraphCtx.showUsers = true;
	instGraphCtx.displayAsTree = false;
	instGraphCtx.showFullTypes = true;
	instGraphCtx.showSource = true;

	PrintGraph(instGraphCtx, module);

	OutputContext::FileClose(outputCtx.stream);
	outputCtx.stream = NULL;
}